

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::bt_peer_connection::on_bitfield(bt_peer_connection *this,int received)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  torrent_info *this_00;
  char *pcVar5;
  bitfield *this_01;
  span<const_char> sVar6;
  int local_d4;
  bitfield local_78;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> bits
  ;
  span<const_char> recv_buffer;
  error_code local_58 [2];
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  int received_local;
  bt_peer_connection *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
       = received;
  peer_connection::associated_torrent((peer_connection *)local_38);
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_28);
  ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
            ((weak_ptr<libtorrent::aux::torrent> *)local_38);
  peer_connection::received_bytes
            (&this->super_peer_connection,0,
             t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._4_4_);
  peVar4 = ::std::
           __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  bVar1 = torrent::valid_metadata(peVar4);
  if (bVar1) {
    iVar3 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
    peVar4 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    this_00 = torrent::torrent_file(peVar4);
    iVar2 = torrent_info::num_pieces(this_00);
    if (iVar3 + -1 != (iVar2 + 7) / 8) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (local_58,invalid_bitfield_size,(type *)0x0);
      (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                (this,local_58,1,2);
      goto LAB_0022c301;
    }
  }
  bVar1 = crypto_receive_buffer::packet_finished(&this->m_recv_buffer);
  if (bVar1) {
    sVar6 = crypto_receive_buffer::get(&this->m_recv_buffer);
    bits.super_bitfield.m_buf.super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
    ._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (bitfield)sVar6.m_ptr;
    typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
    typed_bitfield((typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                    *)&local_78);
    pcVar5 = span<const_char>::data((span<const_char> *)&bits);
    peVar4 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    bVar1 = torrent::valid_metadata(peVar4);
    if (bVar1) {
      this_01 = &peer_connection::get_bitfield(&this->super_peer_connection)->super_bitfield;
      local_d4 = bitfield::size(this_01);
    }
    else {
      iVar3 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
      local_d4 = (iVar3 + -1) * 8;
    }
    bitfield::assign(&local_78,pcVar5 + 1,local_d4);
    peer_connection::incoming_bitfield
              (&this->super_peer_connection,
               (typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                *)&local_78);
    typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
    ~typed_bitfield((typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                     *)&local_78);
  }
LAB_0022c301:
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_28);
  return;
}

Assistant:

void bt_peer_connection::on_bitfield(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		received_bytes(0, received);
		// if we don't have the metadata, we cannot
		// verify the bitfield size
		if (t->valid_metadata()
			&& m_recv_buffer.packet_size() - 1 != (t->torrent_file().num_pieces() + CHAR_BIT - 1) / CHAR_BIT)
		{
			disconnect(errors::invalid_bitfield_size, operation_t::bittorrent, peer_error);
			return;
		}

		if (!m_recv_buffer.packet_finished()) return;

		span<char const> recv_buffer = m_recv_buffer.get();

		typed_bitfield<piece_index_t> bits;
		bits.assign(recv_buffer.data() + 1
			, t->valid_metadata()?get_bitfield().size():(m_recv_buffer.packet_size()-1)*CHAR_BIT);

		incoming_bitfield(bits);
	}